

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_streams.cpp
# Opt level: O3

ssize_t __thiscall BitWriter::write(BitWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  int iVar3;
  void *pvVar4;
  
  if (__buf != (void *)0x0) {
    iVar3 = this->_curBit;
    in_RAX = (ulong)this->_buf;
    pvVar4 = (void *)0x0;
    do {
      iVar2 = (uint)(((uint)__fd >> ((uint)pvVar4 & 0x1f) & 1) != 0) << ((byte)iVar3 & 0x1f);
      bVar1 = (byte)iVar2 | (byte)in_RAX;
      in_RAX = (ulong)CONCAT31((int3)((uint)iVar2 >> 8),bVar1);
      this->_buf = bVar1;
      iVar3 = iVar3 + 1;
      this->_curBit = iVar3;
      if (iVar3 == 8) {
        std::ostream::write((char *)this->_os,(long)&this->_buf);
        this->_curBit = 0;
        this->_buf = '\0';
        in_RAX = 0;
        iVar3 = 0;
      }
      pvVar4 = (void *)((long)pvVar4 + 1);
    } while (__buf != pvVar4);
  }
  return in_RAX;
}

Assistant:

void BitWriter::write(int data, std::size_t length) {
    for (std::size_t i = 0; i < length; ++i) {
        int bit = (data >> i) & 1;
        _buf |= (bit << _curBit);
        _curBit++;
        if (_curBit == BITS_IN_BYTE) {
            _os.write((const char*)&_buf, 1);
            _curBit = 0;
            _buf = 0;
        }
    }
}